

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O0

void nni_posix_udp_dorecv(nni_plat_udp *udp)

{
  ssize_t sVar1;
  int *piVar2;
  nni_sockaddr *na;
  uint local_184;
  undefined1 auStack_180 [4];
  uint i;
  msghdr hdr;
  iovec iov [8];
  nng_err local_bc;
  int cnt;
  int rv;
  nng_sockaddr *sa;
  sockaddr_storage ss;
  nng_iov *aiov;
  nni_list *pnStack_20;
  uint niov;
  nni_list *q;
  nni_aio *aio;
  nni_plat_udp *udp_local;
  
  pnStack_20 = &udp->udp_recvq;
  aio = (nni_aio *)udp;
  do {
    q = (nni_list *)nni_list_first(pnStack_20);
    if ((nni_aio *)q == (nni_aio *)0x0) {
      return;
    }
    local_bc = NNG_OK;
    nni_aio_get_iov((nni_aio *)q,(uint *)((long)&aiov + 4),(nni_iov **)&ss.__ss_align);
    if (8 < aiov._4_4_) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_udp.c"
                ,0x90,"niov <= NNI_AIO_MAX_IOV");
    }
    memset(auStack_180,0,0x38);
    for (local_184 = 0; local_184 < aiov._4_4_; local_184 = local_184 + 1) {
      iov[(ulong)local_184 - 1].iov_len = *(size_t *)(ss.__ss_align + (ulong)local_184 * 0x10);
      iov[local_184].iov_base = *(void **)(ss.__ss_align + (ulong)local_184 * 0x10 + 8);
    }
    hdr._8_8_ = &hdr.msg_flags;
    hdr.msg_iov = (iovec *)(ulong)aiov._4_4_;
    _auStack_180 = &sa;
    hdr.msg_name._0_4_ = 0x80;
    sVar1 = recvmsg(*(int *)&(aio->a_task).task_cb,(msghdr *)auStack_180,0);
    if ((int)sVar1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 == 0xb) {
        return;
      }
      piVar2 = __errno_location();
      if (*piVar2 == 0xb) {
        return;
      }
      piVar2 = __errno_location();
      local_bc = nni_plat_errno(*piVar2);
    }
    else {
      na = (nni_sockaddr *)nni_aio_get_input((nni_aio *)q,0);
      if (na != (nni_sockaddr *)0x0) {
        nni_posix_sockaddr2nn(na,&sa,(ulong)(uint)hdr.msg_name);
      }
    }
    nni_list_remove(pnStack_20,q);
    nni_aio_finish((nni_aio *)q,local_bc,(long)(int)sVar1);
  } while( true );
}

Assistant:

static void
nni_posix_udp_dorecv(nni_plat_udp *udp)
{
	nni_aio  *aio;
	nni_list *q = &udp->udp_recvq;
	// While we're able to recv, do so.
	while ((aio = nni_list_first(q)) != NULL) {
		unsigned                niov;
		nng_iov                *aiov;
		struct sockaddr_storage ss;
		nng_sockaddr           *sa;
		int                     rv  = 0;
		int                     cnt = 0;

		nni_aio_get_iov(aio, &niov, &aiov);
		NNI_ASSERT(niov <= NNI_AIO_MAX_IOV);

#ifdef NNG_HAVE_RECVMSG
		struct iovec  iov[NNI_AIO_MAX_IOV];
		struct msghdr hdr = { .msg_name = NULL };

		for (unsigned i = 0; i < niov; i++) {
			iov[i].iov_base = aiov[i].iov_buf;
			iov[i].iov_len  = aiov[i].iov_len;
		}
		hdr.msg_iov     = iov;
		hdr.msg_iovlen  = niov;
		hdr.msg_name    = &ss;
		hdr.msg_namelen = sizeof(ss);

		if ((cnt = recvmsg(udp->udp_fd, &hdr, 0)) < 0) {
			if ((errno == EAGAIN) || (errno == EWOULDBLOCK)) {
				// No data available at socket.  Leave
				// the AIO at the head of the queue.
				return;
			}
			rv = nni_plat_errno(errno);
		} else if ((sa = nni_aio_get_input(aio, 0)) != NULL) {
			// We need to store the address information.
			// It is incumbent on the AIO submitter to supply
			// storage for the address.
			nni_posix_sockaddr2nn(
			    sa, (void *) &ss, hdr.msg_namelen);
		}
#else // !NNG_HAVE_RECVMSG
      // Here we have to use a bounce buffer
		uint8_t  *buf;
		size_t    len;
		socklen_t salen;
		if (niov == 1) {
			buf = aiov[0].iov_buf;
			len = aiov[0].iov_len;
		} else {
			buf = bouncebuf;
			len = sizeof(bouncebuf);
		}
		salen = sizeof(ss);
		if ((cnt = recvfrom(udp->udp_fd, buf, len, 0, (void *) &ss,
		         &salen)) < 0) {
			if (errno == EAGAIN || errno == EWOULDBLOCK) {
				return;
			}
			rv = nni_plat_errno(errno);
		} else if ((sa = nni_aio_get_input(aio, 0)) != NULL) {
			nni_posix_sockaddr2nn(sa, (void *) &ss, salen);
		}
		if (niov != 1) {
			copy_from_bounce(aiov, niov, cnt);
		}
#endif
		nni_list_remove(q, aio);
		nni_aio_finish(aio, rv, cnt);
	}
}